

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::write_int_data<char>::write_int_data
          (write_int_data<char> *this,int num_digits,string_view prefix,
          basic_format_specs<char> *specs)

{
  type tVar1;
  size_t sVar2;
  int in_ESI;
  ulong *in_RDI;
  int *in_R8;
  type width;
  basic_string_view<char> local_10;
  
  sVar2 = basic_string_view<char>::size(&local_10);
  tVar1 = to_unsigned<int>(in_ESI);
  *in_RDI = sVar2 + tVar1;
  in_RDI[1] = 0;
  if ((*(byte *)((long)in_R8 + 9) & 0xf) == 4) {
    tVar1 = to_unsigned<int>(*in_R8);
    if (*in_RDI < (ulong)tVar1) {
      in_RDI[1] = (ulong)tVar1 - *in_RDI;
      *in_RDI = (ulong)tVar1;
    }
  }
  else if (in_ESI < in_R8[1]) {
    sVar2 = basic_string_view<char>::size(&local_10);
    tVar1 = to_unsigned<int>(in_R8[1]);
    *in_RDI = sVar2 + tVar1;
    tVar1 = to_unsigned<int>(in_R8[1] - in_ESI);
    in_RDI[1] = (ulong)tVar1;
  }
  return;
}

Assistant:

write_int_data(int num_digits, string_view prefix,
                 const basic_format_specs<Char>& specs)
      : size(prefix.size() + to_unsigned(num_digits)), padding(0) {
    if (specs.align == align::numeric) {
      auto width = to_unsigned(specs.width);
      if (width > size) {
        padding = width - size;
        size = width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
    }
  }